

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Factory.cpp
# Opt level: O2

void SoapySDR::Device::unmake(Device *device)

{
  size_type sVar1;
  mapped_type *pmVar2;
  iterator __position;
  runtime_error *this;
  Device *device_local;
  
  device_local = device;
  std::recursive_mutex::lock((recursive_mutex *)getFactoryMutex()::mutex);
  getDeviceCounts();
  sVar1 = std::
          map<SoapySDR::Device_*,_unsigned_long,_std::less<SoapySDR::Device_*>,_std::allocator<std::pair<SoapySDR::Device_*const,_unsigned_long>_>_>
          ::count(&getDeviceCounts::table,&device_local);
  if (sVar1 == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"SoapySDR::Device::unmake() unknown device");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  getDeviceCounts();
  pmVar2 = std::
           map<SoapySDR::Device_*,_unsigned_long,_std::less<SoapySDR::Device_*>,_std::allocator<std::pair<SoapySDR::Device_*const,_unsigned_long>_>_>
           ::operator[](&getDeviceCounts::table,&device_local);
  *pmVar2 = *pmVar2 - 1;
  getDeviceCounts();
  pmVar2 = std::
           map<SoapySDR::Device_*,_unsigned_long,_std::less<SoapySDR::Device_*>,_std::allocator<std::pair<SoapySDR::Device_*const,_unsigned_long>_>_>
           ::operator[](&getDeviceCounts::table,&device_local);
  if (*pmVar2 == 0) {
    getDeviceCounts();
    std::
    _Rb_tree<SoapySDR::Device_*,_std::pair<SoapySDR::Device_*const,_unsigned_long>,_std::_Select1st<std::pair<SoapySDR::Device_*const,_unsigned_long>_>,_std::less<SoapySDR::Device_*>,_std::allocator<std::pair<SoapySDR::Device_*const,_unsigned_long>_>_>
    ::erase(&getDeviceCounts::table._M_t,&device_local);
    if (device_local != (Device *)0x0) {
      (*device_local->_vptr_Device[1])();
    }
    getDeviceTable_abi_cxx11_();
    __position._M_node =
         getDeviceTable[abi:cxx11]()::table_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header.
         _M_left;
    while( true ) {
      getDeviceTable_abi_cxx11_();
      if ((_Rb_tree_header *)__position._M_node ==
          &getDeviceTable[abi:cxx11]()::table_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) break;
      if (__position._M_node[2]._M_left == (_Base_ptr)device_local) {
        getDeviceTable_abi_cxx11_();
        std::
        _Rb_tree<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,std::pair<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const,SoapySDR::Device*>,std::_Select1st<std::pair<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const,SoapySDR::Device*>>,std::less<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>,std::allocator<std::pair<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const,SoapySDR::Device*>>>
        ::erase_abi_cxx11_((_Rb_tree<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,std::pair<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const,SoapySDR::Device*>,std::_Select1st<std::pair<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const,SoapySDR::Device*>>,std::less<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>,std::allocator<std::pair<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const,SoapySDR::Device*>>>
                            *)&getDeviceTable[abi:cxx11]()::table_abi_cxx11_,__position);
        break;
      }
      __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)getFactoryMutex()::mutex);
  return;
}

Assistant:

void SoapySDR::Device::unmake(Device *device)
{
    std::lock_guard<std::recursive_mutex> lock(getFactoryMutex());

    if (getDeviceCounts().count(device) == 0)
    {
        throw std::runtime_error("SoapySDR::Device::unmake() unknown device");
    }

    getDeviceCounts()[device]--;
    if (getDeviceCounts()[device] == 0)
    {
        getDeviceCounts().erase(device);
        delete device;

        //cleanup the argument to device table
        for (auto it = getDeviceTable().begin(); it != getDeviceTable().end(); ++it)
        {
            if (it->second == device)
            {
                getDeviceTable().erase(it);
                return;
            }
        }
    }
}